

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int fd;
  int iVar1;
  int __fd;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar4 = 0;
    do {
      if ((uint)pipes[uVar4][1] < uVar4) {
        iVar1 = fcntl64((ulong)(uint)pipes[uVar4][1],0,stdio_count);
        pipes[uVar4][1] = iVar1;
        if (iVar1 == -1) goto LAB_0015846c;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)stdio_count != uVar4);
    if (0 < stdio_count) {
      iVar1 = 0;
      do {
        __fd = pipes[iVar1][1];
        if (__fd < 0) {
          if (iVar1 < 3) {
            __fd = open64("/dev/null",(uint)(iVar1 != 0) * 2);
            fd = __fd;
            if (__fd != -1) goto LAB_0015837f;
LAB_00158487:
            piVar3 = __errno_location();
            iVar1 = *piVar3;
            goto LAB_00158478;
          }
        }
        else {
          fd = pipes[iVar1][0];
LAB_0015837f:
          if (iVar1 == __fd) {
            uv__cloexec_fcntl(iVar1,0);
          }
          else {
            iVar1 = dup2(__fd,iVar1);
            if (iVar1 == -1) goto LAB_00158487;
          }
          if (iVar1 < 3) {
            uv__nonblock_fcntl(iVar1,0);
          }
          if (stdio_count <= fd) {
            uv__close(fd);
          }
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 < stdio_count);
      if (0 < stdio_count) {
        uVar4 = 0;
        do {
          if (stdio_count <= pipes[uVar4][1]) {
            uv__close(pipes[uVar4][1]);
          }
          uVar4 = uVar4 + 1;
        } while ((uint)stdio_count != uVar4);
      }
    }
  }
  if (options->cwd != (char *)0x0) {
    iVar1 = chdir(options->cwd);
    if (iVar1 != 0) goto LAB_0015846c;
  }
  uVar2 = options->flags;
  if ((uVar2 & 3) != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    setgroups(0,(__gid_t *)0x0);
    *piVar3 = iVar1;
    uVar2 = options->flags;
  }
  if ((uVar2 & 2) != 0) {
    iVar1 = setgid(options->gid);
    if (iVar1 != 0) goto LAB_0015846c;
    uVar2 = options->flags;
  }
  if ((uVar2 & 1) != 0) {
    iVar1 = setuid(options->uid);
    if (iVar1 != 0) goto LAB_0015846c;
  }
  if (options->env != (char **)0x0) {
    _environ = options->env;
  }
  execvp(options->file,options->args);
LAB_0015846c:
  piVar3 = __errno_location();
  iVar1 = *piVar3;
LAB_00158478:
  uv__write_int(error_fd,-iVar1);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0) {
          uv__write_int(error_fd, UV__ERR(errno));
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0) {
    uv__write_int(error_fd, UV__ERR(err));
    _exit(127);
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, UV__ERR(errno));
  _exit(127);
}